

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  
  uVar17 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar14 = 0xffffff6b;
    if (uVar17 == 0) {
      uVar13 = 0;
      uVar9 = 0;
      goto LAB_0013b231;
    }
LAB_0013af35:
    uVar12 = (int)(uVar14 * 0x134413) >> 0x16;
    uVar13 = (ulong)uVar12;
    iVar15 = uVar12 - 1;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x20 - uVar12) * 8);
    bVar7 = (char)((int)((1 - uVar12) * 0x1a934f) >> 0x13) + (char)uVar14;
    uVar16 = uVar17 * 2;
    iVar2 = uVar17 * 2 + 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3 = ZEXT416((uint)(iVar2 << (bVar7 & 0x1f))) * auVar3;
    uVar5 = auVar3._8_8_ * 0x51eb851f;
    uVar6 = uVar5 >> 0x25;
    uVar9 = (uint)(uVar5 >> 0x20);
    uVar4 = uVar9 >> 5;
    uVar8 = (uVar9 >> 5) * -100 + auVar3._8_4_;
    uVar10 = (uint)(uVar1 >> (~bVar7 & 0x3f));
    if (uVar8 <= uVar10) {
      if (uVar8 < uVar10) {
        if (((((uVar17 & 1) == 0) || ((int)uVar14 < -1)) || (uVar8 != 0)) ||
           ((6 < (int)uVar14 &&
            ((0x27 < uVar14 ||
             (*(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                       (long)iVar15 * 8 + 4) <
              (uint)(iVar2 * *(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                                     (long)iVar15 * 8)))))))) {
LAB_0013b1d3:
          uVar14 = uVar9 >> 5 | 0x80;
          uVar17 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar14 = 0;
          uVar9 = uVar9 >> 5;
          if (1 < uVar17) {
            uVar14 = 0;
            do {
              uVar16 = (uint)uVar6 * -0x3d70a3d7;
              uVar9 = (uint)uVar6;
              if (0xa3d70a3 < uVar16) goto LAB_0013b210;
              uVar14 = uVar14 + 2;
              uVar6 = (ulong)uVar16;
            } while ((int)uVar14 < (int)(uVar17 - 1));
            goto LAB_0013b20b;
          }
          goto LAB_0013b210;
        }
        uVar4 = (uVar9 >> 5) - 1;
        uVar8 = 100;
      }
      else if (((-2 < (int)uVar14 && (uVar17 & 1) == 0) &&
               (((int)uVar14 < 7 ||
                ((uVar14 < 0x28 &&
                 (*(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                          (long)iVar15 * 8) * (uVar16 - 1) <=
                  *(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                           (long)iVar15 * 8 + 4))))))) ||
              (((uVar16 - 1) * uVar1 >> ((ulong)(byte)(0x40 - bVar7) & 0x3f) & 1) != 0))
      goto LAB_0013b1d3;
    }
    uVar9 = (uVar8 - (uVar10 >> 1)) + 5;
    if ((uVar9 & 1) == 0) {
      uVar8 = (uVar9 >> 1) * 0xcccd;
      uVar9 = (uVar8 >> 0x12) + uVar4 * 10;
      if ((uVar8 & 0xfffc) < 0x3334) {
        if ((uVar1 * uVar16 >> ((ulong)(byte)(0x40 - bVar7) & 0x3f) & 1) == 0) {
          uVar9 = uVar9 - 1;
        }
        else if ((int)uVar14 < 0x28) {
          if ((int)uVar14 < 7) {
            if ((int)uVar14 < -2) {
              iVar2 = 0;
              if (uVar17 != 0) {
                for (; (uVar16 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
                }
              }
              if (iVar2 <= (int)(iVar15 - uVar14)) goto LAB_0013b231;
            }
          }
          else if (*(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                            (long)iVar15 * 8 + 4) <
                   uVar16 * *(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                                    (long)iVar15 * 8)) goto LAB_0013b231;
          uVar9 = uVar9 & 0xfffffffe;
        }
      }
    }
    else {
      uVar9 = (uVar9 * 0xcccd >> 0x13) + uVar4 * 10;
    }
  }
  else {
    uVar14 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar17 != 0) {
      uVar17 = uVar17 | 0x800000;
      goto LAB_0013af35;
    }
    uVar12 = (int)(uVar14 * 0x134413 + -0x7feff) >> 0x16;
    uVar13 = (ulong)uVar12;
    cVar11 = (char)((int)(uVar12 * -0x1a934f) >> 0x13) + (char)uVar14;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar12) * 8);
    bVar7 = 0x28 - cVar11;
    uVar17 = (uint)((uVar14 & 0xfffffffe) != 2) + (int)(uVar1 - (uVar1 >> 0x19) >> (bVar7 & 0x3f));
    uVar6 = (uVar1 >> 0x18) + uVar1 >> (bVar7 & 0x3f) & 0xffffffff;
    uVar5 = uVar6 / 10;
    uVar9 = (uint)uVar5;
    if ((uint)((int)(uVar6 / 10) * 10) < uVar17) {
      uVar9 = (int)(uVar1 >> (0x27U - cVar11 & 0x3f)) + 1U >> 1;
      if (uVar14 == 0xffffffdd) {
        uVar9 = uVar9 & 0xfffffffe;
      }
      else {
        uVar9 = uVar9 + (uVar9 < uVar17);
      }
      goto LAB_0013b231;
    }
    uVar14 = (uint)(uVar6 / 10) | 0x80;
    uVar17 = 0;
    if (uVar14 != 0) {
      for (; (uVar14 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    uVar14 = 0;
    if (1 < uVar17) {
      uVar14 = 0;
      do {
        uVar9 = (uint)uVar5;
        uVar16 = uVar9 * -0x3d70a3d7;
        if (0xa3d70a3 < uVar16) goto LAB_0013b210;
        uVar14 = uVar14 + 2;
        uVar5 = (ulong)uVar16;
      } while ((int)uVar14 < (int)(uVar17 - 1));
LAB_0013b20b:
      uVar14 = uVar17 & 0xfffffffe;
      uVar9 = uVar16;
    }
LAB_0013b210:
    if (uVar14 < uVar17) {
      uVar17 = uVar9 * -0x33333333;
      if (uVar17 < 0x33333334) {
        uVar9 = uVar17;
      }
      uVar14 = uVar14 | uVar17 < 0x33333334;
    }
    uVar9 = uVar9 >> ((byte)uVar14 & 0x1f);
    uVar13 = (ulong)(uVar12 + 1 + uVar14);
  }
LAB_0013b231:
  return (decimal_fp<float>)((ulong)uVar9 | uVar13 << 0x20);
}

Assistant:

FMT_CONSTEXPR fp normalize(fp value) {
  // Handle subnormals.
  const uint64_t implicit_bit = 1ULL << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::num_significand_bits - num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}